

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * evaluate_logical(dmr_C *C,expression *expr)

{
  symbol *psVar1;
  symbol *psVar2;
  global_symbols_t *pgVar3;
  
  psVar2 = (symbol *)0x0;
  psVar1 = evaluate_conditional(C,(expr->field_5).field_3.unop,0);
  if (psVar1 != (symbol *)0x0) {
    psVar2 = (symbol *)0x0;
    psVar1 = evaluate_conditional(C,(expr->field_5).field_6.right,0);
    if (psVar1 != (symbol *)0x0) {
      pgVar3 = C->S;
      expr->ctype = &pgVar3->int_ctype;
      if ((0xff < *(ushort *)expr) &&
         (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(expr->field_5).field_2.string) >>
           8 & 1) == 0)) {
        *(ushort *)expr = *(ushort *)expr & 0xff;
        pgVar3 = C->S;
      }
      psVar2 = &pgVar3->int_ctype;
    }
  }
  return psVar2;
}

Assistant:

static struct symbol *evaluate_logical(struct dmr_C *C, struct expression *expr)
{
	if (!evaluate_conditional(C, expr->left, 0))
		return NULL;
	if (!evaluate_conditional(C, expr->right, 0))
		return NULL;

	/* the result is int [6.5.13(3), 6.5.14(3)] */
	expr->ctype = &C->S->int_ctype;
	if (expr->flags) {
		if (!(expr->left->flags & expr->right->flags & Int_const_expr))
			expr->flags = 0;
	}
	return &C->S->int_ctype;
}